

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

bool tinygltf::LoadExternalFile
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *out,string *err,string *warn,
               string *filename,string *basedir,bool required,size_t reqBytes,bool checkSize,
               FsCallbacks *fs)

{
  pointer puVar1;
  ExpandFilePathFunction p_Var2;
  pointer puVar3;
  pointer puVar4;
  string *psVar5;
  bool bVar6;
  ostream *poVar7;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  size_t i;
  ulong uVar9;
  string filepath;
  string fileReadErr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  stringstream ss;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_2a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_288;
  string *local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  undefined1 local_1b8 [392];
  
  if ((((fs == (FsCallbacks *)0x0) || (fs->FileExists == (FileExistsFunction)0x0)) ||
      (fs->ExpandFilePath == (ExpandFilePathFunction)0x0)) ||
     (fs->ReadWholeFile == (ReadWholeFileFunction)0x0)) {
    if (err != (string *)0x0) {
      std::__cxx11::string::append((char *)err);
    }
    bVar6 = false;
  }
  else {
    if (required) {
      warn = err;
    }
    puVar1 = (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish != puVar1) {
      (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish = puVar1;
    }
    local_218.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_218.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_218.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_288 = out;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_218,basedir);
    std::__cxx11::string::string((string *)local_1b8,".",(allocator *)&local_258);
    local_280 = warn;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_218,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8);
    std::__cxx11::string::~string((string *)local_1b8);
    if ((fs->ExpandFilePath != (ExpandFilePathFunction)0x0) &&
       (fs->FileExists != (FileExistsFunction)0x0)) {
      lVar8 = 0;
      for (uVar9 = 0;
          uVar9 < (ulong)((long)local_218.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_218.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5); uVar9 = uVar9 + 1)
      {
        p_Var2 = fs->ExpandFilePath;
        JoinPath((string *)local_1b8,
                 (string *)
                 ((long)&((local_218.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar8),
                 filename);
        (*p_Var2)(&local_258,(string *)local_1b8,fs->user_data);
        std::__cxx11::string::~string((string *)local_1b8);
        bVar6 = (*fs->FileExists)(&local_258,fs->user_data);
        if (bVar6) {
          if ((local_258._M_string_length == 0) || (filename->_M_string_length == 0))
          goto LAB_00287290;
          local_2a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          local_238._M_string_length = 0;
          local_2a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_2a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_238.field_2._M_local_buf[0] = '\0';
          bVar6 = (*fs->ReadWholeFile)
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2a8,
                             &local_238,&local_258,fs->user_data);
          psVar5 = local_280;
          if (bVar6) {
            if (local_2a8._M_impl.super__Vector_impl_data._M_finish ==
                local_2a8._M_impl.super__Vector_impl_data._M_start) {
              if (local_280 != (string *)0x0) {
                std::operator+(&local_278,"File is empty : ",&local_258);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1b8,&local_278,"\n");
                std::__cxx11::string::append((string *)psVar5);
                std::__cxx11::string::~string((string *)local_1b8);
                this = &local_278;
                goto LAB_002874d7;
              }
              goto LAB_002874dc;
            }
            if ((checkSize) &&
               ((long)local_2a8._M_impl.super__Vector_impl_data._M_finish -
                (long)local_2a8._M_impl.super__Vector_impl_data._M_start != reqBytes)) {
              std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
              poVar7 = std::operator<<((ostream *)(local_1b8 + 0x10),"File size mismatch : ");
              poVar7 = std::operator<<(poVar7,(string *)&local_258);
              poVar7 = std::operator<<(poVar7,", requestedBytes ");
              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
              poVar7 = std::operator<<(poVar7,", but got ");
              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
              std::endl<char,std::char_traits<char>>(poVar7);
              if (psVar5 != (string *)0x0) {
                std::__cxx11::stringbuf::str();
                std::__cxx11::string::append((string *)psVar5);
                std::__cxx11::string::~string((string *)&local_278);
              }
              std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
              goto LAB_002874dc;
            }
            puVar1 = (local_288->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
            (local_288->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_2a8._M_impl.super__Vector_impl_data._M_end_of_storage;
            puVar3 = (local_288->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            puVar4 = (local_288->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
            (local_288->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start = local_2a8._M_impl.super__Vector_impl_data._M_start;
            (local_288->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_finish = local_2a8._M_impl.super__Vector_impl_data._M_finish;
            bVar6 = true;
            local_2a8._M_impl.super__Vector_impl_data._M_start = puVar3;
            local_2a8._M_impl.super__Vector_impl_data._M_finish = puVar4;
            local_2a8._M_impl.super__Vector_impl_data._M_end_of_storage = puVar1;
          }
          else {
            if (local_280 != (string *)0x0) {
              std::operator+(&local_1f8,"File read error : ",&local_258);
              std::operator+(&local_1d8,&local_1f8," : ");
              std::operator+(&local_278,&local_1d8,&local_238);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1b8,&local_278,"\n");
              std::__cxx11::string::append((string *)psVar5);
              std::__cxx11::string::~string((string *)local_1b8);
              std::__cxx11::string::~string((string *)&local_278);
              std::__cxx11::string::~string((string *)&local_1d8);
              this = &local_1f8;
LAB_002874d7:
              std::__cxx11::string::~string((string *)this);
            }
LAB_002874dc:
            bVar6 = false;
          }
          std::__cxx11::string::~string((string *)&local_238);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&local_2a8);
          goto LAB_002872fb;
        }
        std::__cxx11::string::~string((string *)&local_258);
        lVar8 = lVar8 + 0x20;
      }
    }
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    local_258._M_string_length = 0;
    local_258.field_2._M_local_buf[0] = '\0';
LAB_00287290:
    psVar5 = local_280;
    if (local_280 != (string *)0x0) {
      std::operator+(&local_238,"File not found : ",filename);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                     &local_238,"\n");
      std::__cxx11::string::append((string *)psVar5);
      std::__cxx11::string::~string((string *)local_1b8);
      std::__cxx11::string::~string((string *)&local_238);
    }
    bVar6 = false;
LAB_002872fb:
    std::__cxx11::string::~string((string *)&local_258);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_218);
  }
  return bVar6;
}

Assistant:

static bool LoadExternalFile(std::vector<unsigned char> *out, std::string *err,
                             std::string *warn, const std::string &filename,
                             const std::string &basedir, bool required,
                             size_t reqBytes, bool checkSize, FsCallbacks *fs) {
  if (fs == nullptr || fs->FileExists == nullptr ||
      fs->ExpandFilePath == nullptr || fs->ReadWholeFile == nullptr) {
    // This is a developer error, assert() ?
    if (err) {
      (*err) += "FS callback[s] not set\n";
    }
    return false;
  }

  std::string *failMsgOut = required ? err : warn;

  out->clear();

  std::vector<std::string> paths;
  paths.push_back(basedir);
  paths.push_back(".");

  std::string filepath = FindFile(paths, filename, fs);
  if (filepath.empty() || filename.empty()) {
    if (failMsgOut) {
      (*failMsgOut) += "File not found : " + filename + "\n";
    }
    return false;
  }

  std::vector<unsigned char> buf;
  std::string fileReadErr;
  bool fileRead =
      fs->ReadWholeFile(&buf, &fileReadErr, filepath, fs->user_data);
  if (!fileRead) {
    if (failMsgOut) {
      (*failMsgOut) +=
          "File read error : " + filepath + " : " + fileReadErr + "\n";
    }
    return false;
  }

  size_t sz = buf.size();
  if (sz == 0) {
    if (failMsgOut) {
      (*failMsgOut) += "File is empty : " + filepath + "\n";
    }
    return false;
  }

  if (checkSize) {
    if (reqBytes == sz) {
      out->swap(buf);
      return true;
    } else {
      std::stringstream ss;
      ss << "File size mismatch : " << filepath << ", requestedBytes "
         << reqBytes << ", but got " << sz << std::endl;
      if (failMsgOut) {
        (*failMsgOut) += ss.str();
      }
      return false;
    }
  }

  out->swap(buf);
  return true;
}